

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O0

void __thiscall
cppcms::url_dispatcher::assign<disp>
          (url_dispatcher *this,string *regex,member_type member,disp *object,int e1,int e2,int e3,
          int e4,int e5)

{
  disp *in_RCX;
  member_type in_RDX;
  undefined8 in_RSI;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_RDI;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000020;
  binder5<disp> *this_00;
  binder5<disp> local_78;
  undefined1 local_60 [36];
  undefined4 local_3c;
  
  this_00 = &local_78;
  local_3c = in_R9D;
  binder5<disp>::binder5(this_00,in_RDX,in_RCX);
  std::
  function<void(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)>
  ::function<cppcms::url_dispatcher::binder5<disp>,void>(in_RDI,this_00);
  cppcms::url_dispatcher::assign
            (in_RDI,in_RSI,local_60,local_3c,in_stack_00000008,in_stack_00000010,in_stack_00000018,
             in_stack_00000020);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x14e22d);
  return;
}

Assistant:

void assign(std::string const &regex,void (C::*member)(std::string,std::string,std::string,std::string,std::string),C *object,int e1,int e2,int e3,int e4,int e5)
		{
			assign(regex,binder5<C>(member,object),e1,e2,e3,e4,e5);
		}